

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int havingToWhereExprCb(Walker *pWalker,Expr *pExpr)

{
  undefined8 uVar1;
  Select *pSVar2;
  Expr *pLeft;
  char cVar3;
  u8 uVar4;
  undefined1 uVar5;
  u32 uVar6;
  Expr *pEVar7;
  long lVar8;
  int iVar9;
  Expr *pEVar10;
  Walker *pWVar11;
  Expr *pEVar12;
  long in_FS_OFFSET;
  byte bVar13;
  Walker local_78;
  long local_30;
  
  bVar13 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar9 = 0;
  if (pExpr->op != ',') {
    local_78.pParse = pWalker->pParse;
    pSVar2 = (pWalker->u).pSelect;
    local_78.u = (anon_union_8_18_67db040d_for_u)pSVar2->pGroupBy;
    local_78.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.walkerDepth = -0x55555556;
    local_78.eCode = 1;
    local_78.mWFlags = 0xaaaa;
    local_78.xExprCallback = exprNodeIsConstantOrGroupBy;
    local_78.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    sqlite3WalkExprNN(&local_78,pExpr);
    iVar9 = 1;
    if (((local_78.eCode != 0) && ((pExpr->flags & 0x20000001) != 0x20000000)) &&
       (pExpr->pAggInfo == (AggInfo *)0x0)) {
      local_78.pParse = (Parse *)0x2114f7;
      local_78.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)0xaaaaaaaa00000001;
      pEVar7 = sqlite3ExprAlloc(pWalker->pParse->db,0x9c,(Token *)&local_78,0);
      if (pEVar7 != (Expr *)0x0) {
        pLeft = pSVar2->pWhere;
        pEVar10 = pEVar7;
        pWVar11 = &local_78;
        for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
          pWVar11->pParse = *(undefined8 *)pEVar10;
          pEVar10 = (Expr *)((long)pEVar10 + (ulong)bVar13 * -0x10 + 8);
          pWVar11 = (Walker *)((long)pWVar11 + ((ulong)bVar13 * -2 + 1) * 8);
        }
        pEVar10 = pExpr;
        pEVar12 = pEVar7;
        for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
          cVar3 = pEVar10->affExpr;
          uVar4 = pEVar10->op2;
          uVar5 = pEVar10->field_0x3;
          uVar6 = pEVar10->flags;
          pEVar12->op = pEVar10->op;
          pEVar12->affExpr = cVar3;
          pEVar12->op2 = uVar4;
          pEVar12->field_0x3 = uVar5;
          pEVar12->flags = uVar6;
          pEVar10 = (Expr *)((long)pEVar10 + (ulong)bVar13 * -0x10 + 8);
          pEVar12 = (Expr *)((long)pEVar12 + (ulong)bVar13 * -0x10 + 8);
        }
        pWVar11 = &local_78;
        for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
          uVar1 = pWVar11->pParse;
          pExpr->op = (char)uVar1;
          pExpr->affExpr = (char)((ulong)uVar1 >> 8);
          pExpr->op2 = (char)((ulong)uVar1 >> 0x10);
          pExpr->field_0x3 = (char)((ulong)uVar1 >> 0x18);
          pExpr->flags = (int)((ulong)uVar1 >> 0x20);
          pWVar11 = (Walker *)((long)pWVar11 + ((ulong)bVar13 * -2 + 1) * 8);
          pExpr = (Expr *)((long)pExpr + (ulong)bVar13 * -0x10 + 8);
        }
        pEVar7 = sqlite3ExprAnd(pWalker->pParse,pLeft,pEVar7);
        pSVar2->pWhere = pEVar7;
        pWalker->eCode = 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar9;
  }
  __stack_chk_fail();
}

Assistant:

static int havingToWhereExprCb(Walker *pWalker, Expr *pExpr){
  if( pExpr->op!=TK_AND ){
    Select *pS = pWalker->u.pSelect;
    /* This routine is called before the HAVING clause of the current
    ** SELECT is analyzed for aggregates. So if pExpr->pAggInfo is set
    ** here, it indicates that the expression is a correlated reference to a
    ** column from an outer aggregate query, or an aggregate function that
    ** belongs to an outer query. Do not move the expression to the WHERE
    ** clause in this obscure case, as doing so may corrupt the outer Select
    ** statements AggInfo structure.  */
    if( sqlite3ExprIsConstantOrGroupBy(pWalker->pParse, pExpr, pS->pGroupBy)
     && ExprAlwaysFalse(pExpr)==0
     && pExpr->pAggInfo==0
    ){
      sqlite3 *db = pWalker->pParse->db;
      Expr *pNew = sqlite3Expr(db, TK_INTEGER, "1");
      if( pNew ){
        Expr *pWhere = pS->pWhere;
        SWAP(Expr, *pNew, *pExpr);
        pNew = sqlite3ExprAnd(pWalker->pParse, pWhere, pNew);
        pS->pWhere = pNew;
        pWalker->eCode = 1;
      }
    }
    return WRC_Prune;
  }
  return WRC_Continue;
}